

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ColonExpressionClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ColonExpressionClauseSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ColonExpressionClauseSyntax *pCVar6;
  
  pCVar6 = (ColonExpressionClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ColonExpressionClauseSyntax *)this->endPtr < pCVar6 + 1) {
    pCVar6 = (ColonExpressionClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pCVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pCVar6->super_SyntaxNode).kind = ColonExpressionClause;
  (pCVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pCVar6->colon).kind = TVar2;
  (pCVar6->colon).field_0x2 = uVar3;
  (pCVar6->colon).numFlags = (NumericTokenFlags)NVar4.raw;
  (pCVar6->colon).rawLen = uVar5;
  (pCVar6->colon).info = pIVar1;
  (pCVar6->expr).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pCVar6->super_SyntaxNode;
  return pCVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }